

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetPointDepth(ON_Viewport *this,ON_3dPoint point,double *view_plane_depth)

{
  double dVar1;
  ON_3dVector local_40;
  double depth;
  double *pdStack_18;
  bool rc;
  double *view_plane_depth_local;
  ON_Viewport *this_local;
  
  depth._7_1_ = false;
  if ((point.x != -1.23432101234321e+308) || (NAN(point.x))) {
    pdStack_18 = view_plane_depth;
    view_plane_depth_local = (double *)this;
    ON_3dPoint::operator-(&local_40,&this->m_CamLoc,&point);
    dVar1 = ON_3dVector::operator*(&local_40,&this->m_CamZ);
    if (pdStack_18 != (double *)0x0) {
      *pdStack_18 = dVar1;
    }
    depth._7_1_ = true;
  }
  return (bool)depth._7_1_;
}

Assistant:

bool ON_Viewport::GetPointDepth(       
       ON_3dPoint point,
       double* view_plane_depth
       ) const
{
  bool rc = false;
  if ( point.x != ON_UNSET_VALUE )
  {
    double depth = (m_CamLoc - point)*m_CamZ;
    if ( 0 != view_plane_depth )
      *view_plane_depth = depth;
    rc = true;
  }
  return rc;
}